

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O0

int run_test_pipe_getsockname_blocking(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
            ,0x11d,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(pipe_getsockname_blocking) {
#ifdef _WIN32
  HANDLE readh, writeh;
  char buf1[1024], buf2[1024];
  size_t len1, len2;
  int r;

  r = CreatePipe(&readh, &writeh, NULL, 65536);
  ASSERT(r);

  r = uv_pipe_init(uv_default_loop(), &pipe_client, 0);
  ASSERT_OK(r);
  r = uv_pipe_open(&pipe_client, readh);
  ASSERT_OK(r);
  r = uv_read_start((uv_stream_t*) &pipe_client,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_OK(r);
  Sleep(100);
  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT_OK(r);

  len1 = sizeof buf1;
  r = uv_pipe_getsockname(&pipe_client, buf1, &len1);
  ASSERT_OK(r);
  ASSERT_OK(len1);  /* It's an annonymous pipe. */

  r = uv_read_start((uv_stream_t*)&pipe_client,
                    (uv_alloc_cb) abort,
                    (uv_read_cb) abort);
  ASSERT_OK(r);
  Sleep(100);

  len2 = sizeof buf2;
  r = uv_pipe_getsockname(&pipe_client, buf2, &len2);
  ASSERT_OK(r);
  ASSERT_OK(len2);  /* It's an annonymous pipe. */

  r = uv_read_stop((uv_stream_t*)&pipe_client);
  ASSERT_OK(r);

  ASSERT_EQ(len1, len2);
  ASSERT_OK(memcmp(buf1, buf2, len1));

  pipe_close_cb_called = 0;
  uv_close((uv_handle_t*)&pipe_client, pipe_close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, pipe_close_cb_called);

  CloseHandle(writeh);
#endif

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}